

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall
amrex::StateData::restart
          (StateData *this,istream *is,Box *p_domain,BoxArray *grds,DistributionMapping *dm,
          FabFactory<amrex::FArrayBox> *factory,StateDescriptor *d,string *chkfile)

{
  byte bVar1;
  undefined8 *in_RDX;
  long in_RDI;
  long *in_R9;
  string *in_stack_00000008;
  istream *in_stack_00000010;
  StateData *in_stack_00000018;
  BoxArray grids_in;
  Box domain_in;
  IndexType typ;
  int off;
  uint bitval;
  uint typ_1;
  int dir;
  BoxArray *in_stack_fffffffffffffe58;
  BoxArray *in_stack_fffffffffffffe60;
  BoxArray *this_00;
  BoxArray *in_stack_fffffffffffffe68;
  Box *in_stack_fffffffffffffe98;
  istream *in_stack_fffffffffffffea0;
  istream *in_stack_fffffffffffffea8;
  BoxArray *in_stack_fffffffffffffeb0;
  undefined1 local_108 [88];
  element_type *local_b0;
  int local_a8;
  uint local_a4;
  uint local_a0;
  int local_9c;
  long local_98;
  uint local_90;
  int local_8c;
  uint *local_88;
  int local_7c;
  uint *local_78;
  int local_70;
  int local_6c;
  long local_68;
  uint local_60;
  int local_5c;
  BoxArray *local_58;
  int local_4c;
  uint *local_48;
  int local_3c;
  uint *local_38;
  int local_2c;
  int local_28;
  int local_24;
  BoxArray *local_20;
  int local_18;
  int local_14;
  BoxArray *local_10;
  int local_4;
  
  *(string **)(in_RDI + 8) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = *in_RDX;
  *(undefined8 *)(in_RDI + 0x18) = in_RDX[1];
  *(undefined8 *)(in_RDI + 0x20) = in_RDX[2];
  *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RDX + 3);
  local_108._40_8_ = in_R9;
  BoxArray::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  DistributionMapping::operator=
            ((DistributionMapping *)in_stack_fffffffffffffe60,
             (DistributionMapping *)in_stack_fffffffffffffe58);
  (**(code **)(*(long *)local_108._40_8_ + 0x28))();
  std::
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ::reset((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           *)in_stack_fffffffffffffe60,(pointer)in_stack_fffffffffffffe58);
  local_108._36_4_ = StateDescriptor::getType(*(StateDescriptor **)(in_RDI + 8));
  local_b0 = (element_type *)(local_108 + 0x24);
  if (local_108._36_4_ != 0) {
    local_98 = in_RDI + 0x10;
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      local_78 = &local_90;
      local_7c = local_9c;
      local_4c = local_9c;
      local_28 = local_9c;
      bVar1 = (byte)local_9c;
      local_a0 = (uint)((local_108._36_4_ & 1 << (bVar1 & 0x1f)) != 0);
      local_88 = (uint *)(in_RDI + 0x28);
      local_8c = local_9c;
      local_3c = local_9c;
      local_2c = local_9c;
      local_a4 = (uint)((*local_88 & 1 << (bVar1 & 0x1f)) != 0);
      local_a8 = local_a0 - local_a4;
      local_68 = in_RDI + 0x1c;
      local_6c = local_9c;
      *(int *)(local_68 + (long)local_9c * 4) = local_a8 + *(int *)(local_68 + (long)local_9c * 4);
      in_stack_fffffffffffffe68 = (BoxArray *)(in_RDI + 0x28);
      local_5c = local_9c;
      if (local_a0 == 0) {
        local_24 = local_9c;
        local_18 = local_9c;
        (in_stack_fffffffffffffe68->m_bat).m_bat_type =
             (1 << (bVar1 & 0x1f) ^ ~null) & (in_stack_fffffffffffffe68->m_bat).m_bat_type;
        local_20 = in_stack_fffffffffffffe68;
      }
      else {
        local_14 = local_9c;
        local_4 = local_9c;
        (in_stack_fffffffffffffe68->m_bat).m_bat_type =
             1 << (bVar1 & 0x1f) | (in_stack_fffffffffffffe68->m_bat).m_bat_type;
        local_10 = in_stack_fffffffffffffe68;
      }
      local_70 = local_a8;
      local_60 = local_a0;
      local_58 = in_stack_fffffffffffffe68;
      local_48 = local_78;
      local_38 = local_88;
    }
    local_108._28_4_ = local_108._36_4_;
    local_108._32_4_ = local_108._36_4_;
    local_90 = local_108._36_4_;
    BoxArray::convert(in_stack_fffffffffffffe68,(IndexType)(uint)((ulong)local_98 >> 0x20));
  }
  this_00 = (BoxArray *)local_108;
  Box::Box((Box *)this_00);
  BoxArray::BoxArray(this_00);
  amrex::operator>>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  BoxArray::readFrom(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  BoxArray::~BoxArray(this_00);
  restartDoit(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void
StateData::restart (std::istream&          is,
                    const Box&             p_domain,
                    const BoxArray&        grds,
                    const DistributionMapping& dm,
                    const FabFactory<FArrayBox>& factory,
                    const StateDescriptor& d,
                    const std::string&     chkfile)
{
    desc = &d;
    arena = nullptr;
    domain = p_domain;
    grids = grds;
    dmap = dm;
    m_factory.reset(factory.clone());

    // Convert to proper type.
    IndexType typ(desc->getType());
    if (!typ.cellCentered()) {
        domain.convert(typ);
        grids.convert(typ);
    }

    {
        Box domain_in;
        BoxArray grids_in;
        is >> domain_in;
        grids_in.readFrom(is);
        BL_ASSERT(domain_in == domain);
        BL_ASSERT(amrex::match(grids_in,grids));
    }

    restartDoit(is, chkfile);
}